

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O0

void api_suite::test_ctor(void)

{
  value_type *pvVar1;
  bool bVar2;
  undefined1 auStack_198 [8];
  covariance<double,_4> massign;
  covariance<double,_4> mover;
  covariance<double,_4> assign;
  covariance<double,_4> copy;
  covariance<double,_4> filter;
  
  pvVar1 = &copy.passive.center;
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)pvVar1);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)pvVar1,1.0,1.0);
  bVar2 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::empty
                    ((basic_comoment<double,_4UL,_(trial::online::with)2> *)pvVar1);
  boost::detail::test_impl
            ("!filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x1a,"void api_suite::test_ctor()",!bVar2);
  copy.passive.y_center.member.mean = filter.passive.y_center.member.mean;
  copy.passive.y_center.member.count = filter.passive.y_center.member.count;
  copy.passive.x_center.member.mean = filter.passive.x_center.member.mean;
  copy.passive.x_center.member.count = filter.passive.x_center.member.count;
  copy.active.y_center.member.count = filter.active.y_center.member.count;
  copy.active.center = filter.active.center;
  copy.active.x_center.member.count = filter.active.x_center.member.count;
  copy.active.y_center.member.mean = filter.active.y_center.member.mean;
  assign.passive.center = copy.passive.center;
  copy.active.x_center.member.mean = filter.active.x_center.member.mean;
  bVar2 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::empty
                    ((basic_comoment<double,_4UL,_(trial::online::with)2> *)&assign.passive.center);
  boost::detail::test_impl
            ("!copy.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x1e,"void api_suite::test_ctor()",!bVar2);
  pvVar1 = &mover.passive.center;
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)pvVar1);
  assign.passive.y_center.member.mean = filter.passive.y_center.member.mean;
  assign.passive.y_center.member.count = filter.passive.y_center.member.count;
  assign.passive.x_center.member.mean = filter.passive.x_center.member.mean;
  assign.passive.x_center.member.count = filter.passive.x_center.member.count;
  assign.active.y_center.member.count = filter.active.y_center.member.count;
  assign.active.center = filter.active.center;
  assign.active.x_center.member.count = filter.active.x_center.member.count;
  assign.active.y_center.member.mean = filter.active.y_center.member.mean;
  mover.passive.center = copy.passive.center;
  assign.active.x_center.member.mean = filter.active.x_center.member.mean;
  bVar2 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::empty
                    ((basic_comoment<double,_4UL,_(trial::online::with)2> *)pvVar1);
  boost::detail::test_impl
            ("!assign.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x23,"void api_suite::test_ctor()",!bVar2);
  mover.passive.y_center.member.mean = copy.passive.y_center.member.mean;
  mover.passive.y_center.member.count = copy.passive.y_center.member.count;
  mover.passive.x_center.member.mean = copy.passive.x_center.member.mean;
  mover.passive.x_center.member.count = copy.passive.x_center.member.count;
  mover.active.y_center.member.count = copy.active.y_center.member.count;
  mover.active.center = copy.active.center;
  mover.active.x_center.member.count = copy.active.x_center.member.count;
  mover.active.y_center.member.mean = copy.active.y_center.member.mean;
  massign.passive.center = assign.passive.center;
  mover.active.x_center.member.mean = copy.active.x_center.member.mean;
  bVar2 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::empty
                    ((basic_comoment<double,_4UL,_(trial::online::with)2> *)&massign.passive.center)
  ;
  boost::detail::test_impl
            ("!mover.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x27,"void api_suite::test_ctor()",!bVar2);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)auStack_198);
  massign.passive.y_center.member.mean = assign.passive.y_center.member.mean;
  massign.passive.y_center.member.count = assign.passive.y_center.member.count;
  massign.passive.x_center.member.mean = assign.passive.x_center.member.mean;
  massign.passive.x_center.member.count = assign.passive.x_center.member.count;
  massign.active.y_center.member.count = assign.active.y_center.member.count;
  massign.active.center = assign.active.center;
  massign.active.x_center.member.count = assign.active.x_center.member.count;
  massign.active.y_center.member.mean = assign.active.y_center.member.mean;
  auStack_198 = (undefined1  [8])mover.passive.center;
  massign.active.x_center.member.mean = assign.active.x_center.member.mean;
  bVar2 = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::empty
                    ((basic_comoment<double,_4UL,_(trial::online::with)2> *)auStack_198);
  boost::detail::test_impl
            ("!massign.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x2c,"void api_suite::test_ctor()",(bool)(bVar2 - 1U & 1));
  return;
}

Assistant:

void test_ctor()
{
    interim::covariance<double, 4> filter;
    filter.push(1.0, 1.0);
    TRIAL_TEST(!filter.empty());

    // Copy constructor
    interim::covariance<double, 4> copy(filter);
    TRIAL_TEST(!copy.empty());

    // Copy assignment
    interim::covariance<double, 4> assign;
    assign = filter;
    TRIAL_TEST(!assign.empty());

    // Move constructor
    interim::covariance<double, 4> mover(std::move(copy));
    TRIAL_TEST(!mover.empty());

    // Move assignment
    interim::covariance<double, 4> massign;
    massign = std::move(assign);
    TRIAL_TEST(!massign.empty());
}